

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_effect_lower_bound(parser *p)

{
  wchar_t wVar1;
  long *plVar2;
  parser_error pVar3;
  
  plVar2 = (long *)parser_priv(p);
  wVar1 = parser_getint(p,"bound");
  if (plVar2 != (long *)0x0) {
    if (*plVar2 == 0) {
      pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      pVar3 = PARSE_ERROR_INVALID_VALUE;
      if ((uint)wVar1 < 0x8000) {
        *(wchar_t *)(*plVar2 + 0x5c) = wVar1;
        pVar3 = PARSE_ERROR_NONE;
      }
    }
    return pVar3;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,599,"enum parser_error parse_player_timed_effect_lower_bound(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_effect_lower_bound(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	int bound = parser_getint(p, "bound");

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/*
	 * Don't allow negative lower bounds (breaks the logic for testing
	 * whether a timed effect is active).  Also, since int16_t is used to
	 * store a timed effect's duration in struct player, don't allow
	 * lower bounds that aren't compatible with that.
	 */
	if (bound < 0 || bound > 32767) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	ps->t->lower_bound = bound;
	return PARSE_ERROR_NONE;
}